

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O3

_Bool make_attack_normal(monster_conflict *mon,player *p)

{
  loc_conflict grid2;
  monster_race *pmVar1;
  monster_blow *pmVar2;
  blow_method *pbVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  byte bVar8;
  _Bool _Var9;
  _Bool _Var10;
  int iVar11;
  uint32_t uVar12;
  wchar_t wVar13;
  monster_lore *lore;
  melee_effect_handler_f p_Var14;
  byte bVar15;
  wchar_t rlev;
  ulong uVar16;
  char cVar17;
  char cVar18;
  long lVar19;
  wchar_t wVar20;
  random_value v;
  random_value dice;
  random_value dice_00;
  source sVar21;
  source origin;
  melee_effect_handler_context_t context;
  char m_name [80];
  char ddesc [80];
  
  lore = get_lore(mon->race);
  wVar20 = mon->race->level;
  rlev = L'\x01';
  if (L'\x01' < wVar20) {
    rlev = wVar20;
  }
  _Var9 = flag_has_dbg(mon->race->flags,0xb,0x14,"mon->race->flags","RF_NEVER_BLOW");
  if (!_Var9) {
    monster_desc(m_name,0x50,(monster *)mon,L'̔');
    monster_desc(ddesc,0x50,(monster *)mon,L'\x88');
    if (z_info->mon_blows_max != 0) {
      lVar19 = 0;
      uVar16 = 0;
      bVar8 = 0;
      do {
        grid2 = p->grid;
        _Var10 = monster_is_visible((monster *)mon);
        pmVar1 = mon->race;
        bVar7 = true;
        if (!_Var10) {
          bVar7 = L'\0' < pmVar1->light;
        }
        pmVar2 = pmVar1->blow;
        pbVar3 = *(blow_method **)((long)&pmVar2->method + lVar19);
        if (((pbVar3 == (blow_method *)0x0) || (p->is_dead != false)) ||
           (p->upkeep->generate_level != false)) break;
        puVar4 = *(undefined8 **)((long)&pmVar2->effect + lVar19);
        if (puVar4 == (undefined8 *)0x0) {
          __assert_fail("effect",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-attack.c"
                        ,0x24c,"_Bool make_attack_normal(struct monster *, struct player *)");
        }
        uVar5 = *(undefined8 *)((long)&(pmVar2->dice).base + lVar19);
        uVar6 = *(undefined8 *)((long)&(pmVar2->dice).sides + lVar19);
        iVar11 = strcmp((char *)*puVar4,"NONE");
        if (iVar11 != 0) {
          iVar11 = pmVar1->level * 3;
          if (pmVar1->level < L'\x01') {
            iVar11 = 3;
          }
          wVar20 = iVar11 + *(int *)(puVar4 + 1);
          if (mon->m_timed[1] != 0) {
            wVar20 = (wVar20 * 0x4b) / 100;
          }
          equip_learn_on_defend(p);
          _Var10 = test_hit(wVar20,(p->state).to_a + (p->state).ac);
          if (_Var10) goto LAB_00165289;
          _Var10 = monster_is_visible((monster *)mon);
          if ((_Var10) && (pbVar3->miss == true)) {
            disturb(p);
            msg("%s misses you.",m_name);
          }
          wVar20 = L'\0';
          bVar15 = 0;
          goto LAB_00165633;
        }
LAB_00165289:
        disturb(p);
        if (0 < p->timed[0xb]) {
          _Var10 = monster_is_visible((monster *)mon);
          if (_Var10) {
            flag_on_dbg(lore->flags,0xb,0x3d,"lore->flags","RF_EVIL");
          }
          _Var10 = monster_is_evil((monster *)mon);
          if (((!_Var10) || (p->lev < rlev)) ||
             (uVar12 = Rand_div(100), (int)((int)p->lev + uVar12) < 0x33)) goto LAB_0016531a;
          msg("%s is repelled.",m_name);
          goto LAB_00165678;
        }
LAB_0016531a:
        cVar18 = pbVar3->cut;
        cVar17 = pbVar3->stun;
        v.sides = (int)uVar6;
        v.m_bonus = (int)((ulong)uVar6 >> 0x20);
        v.base = (int)uVar5;
        v.dice = (int)((ulong)uVar5 >> 0x20);
        wVar20 = randcalc(v,rlev,RANDOMISE);
        if (mon->m_timed[1] != 0) {
          wVar20 = (wVar20 * 0x4b) / 100;
        }
        p_Var14 = melee_handler_for_blow_effect((char *)*puVar4);
        if (p_Var14 == (melee_effect_handler_f)0x0) {
          msg("ERROR: Effect handler not found for %s.",*puVar4);
          bVar15 = 1;
        }
        else {
          context.t_mon = (monster_conflict *)0x0;
          context.ac = (p->state).to_a + (p->state).ac;
          context.ddesc = ddesc;
          context.obvious = true;
          context.blinked = (_Bool)(bVar8 & 1);
          context.m_name = m_name;
          context.p = p;
          context.mon = mon;
          context.rlev = rlev;
          context.method = pbVar3;
          context.damage = wVar20;
          (*p_Var14)(&context);
          wVar20 = context.damage;
          bVar15 = context.obvious;
          bVar8 = context.blinked;
        }
        if (p->is_dead != false) {
          cVar17 = '\0';
          cVar18 = '\0';
        }
        if ((cVar18 == '\x01') && (cVar17 != '\0')) {
          uVar12 = Rand_div(100);
          if ((int)uVar12 < 0x32) {
            cVar18 = '\0';
          }
          else {
            cVar17 = '\0';
          }
        }
        if (cVar18 == '\0') goto switchD_001654fa_caseD_0;
        dice.sides = (int)uVar6;
        dice.m_bonus = (int)((ulong)uVar6 >> 0x20);
        dice.base = (int)uVar5;
        dice.dice = (int)((ulong)uVar5 >> 0x20);
        wVar13 = monster_critical(dice,rlev,wVar20);
        uVar12 = 5;
        switch(wVar13) {
        case L'\0':
          goto switchD_001654fa_caseD_0;
        case L'\x01':
          break;
        case L'\x02':
          wVar13 = L'\x06';
          break;
        case L'\x03':
          wVar13 = L'\x15';
          uVar12 = 0x14;
          break;
        case L'\x04':
          wVar13 = L'3';
          uVar12 = 0x32;
          break;
        case L'\x05':
          wVar13 = L'e';
          uVar12 = 100;
          break;
        case L'\x06':
          wVar13 = L'Ĭ';
          goto LAB_00165558;
        default:
          wVar13 = L'Ǵ';
          goto LAB_00165558;
        }
        uVar12 = Rand_div(uVar12);
        wVar13 = uVar12 + wVar13;
        if (wVar13 != L'\0') {
LAB_00165558:
          player_inc_timed(p,L'\b',wVar13,true,true,true);
        }
switchD_001654fa_caseD_0:
        if (cVar17 == '\0') {
switchD_001655a8_caseD_0:
          goto LAB_00165633;
        }
        dice_00.sides = (int)uVar6;
        dice_00.m_bonus = (int)((ulong)uVar6 >> 0x20);
        dice_00.base = (int)uVar5;
        dice_00.dice = (int)((ulong)uVar5 >> 0x20);
        wVar13 = monster_critical(dice_00,rlev,wVar20);
        switch(wVar13) {
        case L'\0':
          goto switchD_001655a8_caseD_0;
        case L'\x01':
          uVar12 = 5;
          break;
        case L'\x02':
          wVar13 = L'\v';
          uVar12 = 10;
          break;
        case L'\x03':
          wVar13 = L'\x15';
          uVar12 = 0x14;
          break;
        case L'\x04':
          wVar13 = L'\x1f';
          uVar12 = 0x1e;
          break;
        case L'\x05':
          wVar13 = L')';
          uVar12 = 0x28;
          break;
        case L'\x06':
          wVar13 = L'd';
          goto LAB_00165603;
        default:
          wVar13 = L'È';
          goto LAB_00165603;
        }
        uVar12 = Rand_div(uVar12);
        wVar13 = uVar12 + wVar13;
        if (wVar13 != L'\0') {
LAB_00165603:
          player_inc_timed(p,L'\t',wVar13,true,true,true);
        }
LAB_00165633:
        if (bVar7) {
          iVar11 = *(int *)((long)&lore->blows->times_seen + lVar19);
          if (((byte)(10 < iVar11 | bVar15 | wVar20 != L'\0') == 1) && (iVar11 < 0xff)) {
            *(int *)((long)&lore->blows->times_seen + lVar19) = iVar11 + 1;
          }
        }
        _Var10 = loc_eq(p->grid,grid2);
        if (!_Var10) break;
LAB_00165678:
        uVar16 = uVar16 + 1;
        lVar19 = lVar19 + 0x30;
      } while (uVar16 < z_info->mon_blows_max);
      if ((bVar8 & 1) != 0) {
        if ((p->is_dead == false) && (_Var10 = square_isseen(cave,mon->grid), _Var10)) {
          add_monster_message(mon,L'4',true);
        }
        strnfmt((char *)&context,5,"%d",(ulong)((uint)z_info->max_sight * 2 + 5));
        sVar21 = source_monster(mon->midx);
        origin.which = sVar21.which;
        origin._4_4_ = 0;
        origin.what = sVar21.what;
        effect_simple(L':',origin,(char *)&context,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
      }
    }
    if ((p->is_dead == true) && (lore->deaths < 0x7fff)) {
      lore->deaths = lore->deaths + 1;
    }
    lore_update(mon->race,lore);
  }
  return !_Var9;
}

Assistant:

bool make_attack_normal(struct monster *mon, struct player *p)
{
	struct monster_lore *lore = get_lore(mon->race);
	int rlev = ((mon->race->level >= 1) ? mon->race->level : 1);
	int ap_cnt;
	char m_name[80];
	char ddesc[80];
	bool blinked = false;

	/* Not allowed to attack */
	if (rf_has(mon->race->flags, RF_NEVER_BLOW)) return (false);

	/* Get the monster name (or "it") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);

	/* Get the "died from" information (i.e. "a kobold") */
	monster_desc(ddesc, sizeof(ddesc), mon, MDESC_SHOW | MDESC_IND_VIS);

	/* Scan through all blows */
	for (ap_cnt = 0; ap_cnt < z_info->mon_blows_max; ap_cnt++) {
		struct loc pgrid = p->grid;
		bool visible = monster_is_visible(mon) || (mon->race->light > 0);
		bool obvious = false;

		int damage = 0;
		bool do_cut = false;
		bool do_stun = false;

		/* Extract the attack infomation */
		struct blow_effect *effect = mon->race->blow[ap_cnt].effect;
		struct blow_method *method = mon->race->blow[ap_cnt].method;
		random_value dice = mon->race->blow[ap_cnt].dice;

		/* No more attacks */
		if (!method) break;

		/* Handle "leaving" */
		if (p->is_dead || p->upkeep->generate_level) break;

		/* Monster hits player */
		assert(effect);
		if (streq(effect->name, "NONE") ||
			check_hit(p, chance_of_monster_hit(mon, effect))) {
			melee_effect_handler_f effect_handler;

			/* Always disturbing */
			disturb(p);

			/* Hack -- Apply "protection from evil" */
			if (p->timed[TMD_PROTEVIL] > 0) {
				/* Learn about the evil flag */
				if (monster_is_visible(mon))
					rf_on(lore->flags, RF_EVIL);

				if (monster_is_evil(mon) && p->lev >= rlev &&
				    randint0(100) + p->lev > 50) {
					/* Message */
					msg("%s is repelled.", m_name);

					/* Hack -- Next attack */
					continue;
				}
			}

			do_cut = method->cut;
			do_stun = method->stun;

			/* Hack -- assume all attacks are obvious */
			obvious = true;

			/* Roll dice */
			damage = randcalc(dice, rlev, RANDOMISE);

			/* Reduce damage when stunned */
			if (mon->m_timed[MON_TMD_STUN]) {
				damage = (damage * (100 - STUN_DAM_REDUCTION)) / 100;
			}

			/* Perform the actual effect. */
			effect_handler = melee_handler_for_blow_effect(effect->name);
			if (effect_handler != NULL) {
				melee_effect_handler_context_t context = {
					p,
					mon,
					NULL,
					rlev,
					method,
					p->state.ac + p->state.to_a,
					ddesc,
					obvious,
					blinked,
					damage,
					m_name
				};

				effect_handler(&context);

				/* Save any changes made in the handler for later use. */
				obvious = context.obvious;
				blinked = context.blinked;
				damage = context.damage;
			} else {
				msg("ERROR: Effect handler not found for %s.", effect->name);
			}

			/* Don't cut or stun if player is dead */
			if (p->is_dead) {
				do_cut = false;
				do_stun = false;
			}

			/* Hack -- only one of cut or stun */
			if (do_cut && do_stun) {
				/* Cancel cut */
				if (randint0(100) < 50)
					do_cut = false;

				/* Cancel stun */
				else
					do_stun = false;
			}

			/* Handle cut */
			if (do_cut) {
				/* Critical hit (zero if non-critical) */
				int amt, tmp = monster_critical(dice, rlev, damage);

				/* Roll for damage */
				switch (tmp) {
					case 0: amt = 0; break;
					case 1: amt = randint1(5); break;
					case 2: amt = randint1(5) + 5; break;
					case 3: amt = randint1(20) + 20; break;
					case 4: amt = randint1(50) + 50; break;
					case 5: amt = randint1(100) + 100; break;
					case 6: amt = 300; break;
					default: amt = 500; break;
				}

				/* Apply the cut */
				if (amt) {
					(void)player_inc_timed(p, TMD_CUT, amt,
						true, true, true);
				}
			}

			/* Handle stun */
			if (do_stun) {
				/* Critical hit (zero if non-critical) */
				int amt, tmp = monster_critical(dice, rlev, damage);

				/* Roll for damage */
				switch (tmp) {
					case 0: amt = 0; break;
					case 1: amt = randint1(5); break;
					case 2: amt = randint1(10) + 10; break;
					case 3: amt = randint1(20) + 20; break;
					case 4: amt = randint1(30) + 30; break;
					case 5: amt = randint1(40) + 40; break;
					case 6: amt = 100; break;
					default: amt = 200; break;
				}

				/* Apply the stun */
				if (amt) {
					(void)player_inc_timed(p, TMD_STUN, amt,
						true, true, true);
				}
			}
		} else {
			/* Visible monster missed player, so notify if appropriate. */
			if (monster_is_visible(mon) &&	method->miss) {
				/* Disturbing */
				disturb(p);
				msg("%s misses you.", m_name);
			}
		}

		/* Analyze "visible" monsters only */
		if (visible) {
			/* Count "obvious" attacks (and ones that cause damage) */
			if (obvious || damage || (lore->blows[ap_cnt].times_seen > 10)) {
				/* Count attacks of this type */
				if (lore->blows[ap_cnt].times_seen < UCHAR_MAX)
					lore->blows[ap_cnt].times_seen++;
			}
		}

		/* Skip the other blows if the player has moved */
		if (!loc_eq(p->grid, pgrid)) break;
	}

	/* Blink away */
	if (blinked) {
		char dice[5];

		if (!p->is_dead && square_isseen(cave, mon->grid)) {
			add_monster_message(mon, MON_MSG_HIT_AND_RUN, true);
		}
		strnfmt(dice, sizeof(dice), "%d", z_info->max_sight * 2 + 5);
		effect_simple(EF_TELEPORT, source_monster(mon->midx), dice, 0, 0, 0, 0, 0, NULL);
	}

	/* Always notice cause of death */
	if (p->is_dead && (lore->deaths < SHRT_MAX))
		lore->deaths++;

	/* Learn lore */
	lore_update(mon->race, lore);

	/* Assume we attacked */
	return (true);
}